

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O2

void __thiscall zmq::array_t<zmq::pipe_t,_2>::push_back(array_t<zmq::pipe_t,_2> *this,pipe_t *item_)

{
  pipe_t *local_8;
  
  if (item_ != (pipe_t *)0x0) {
    (item_->super_array_item_t<2>)._array_index =
         (int)((ulong)((long)(this->_items).
                             super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->_items).
                            super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  local_8 = item_;
  std::vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>::push_back(&this->_items,&local_8);
  return;
}

Assistant:

void push_back (T *item_)
    {
        if (item_)
            static_cast<item_t *> (item_)->set_array_index (
              static_cast<int> (_items.size ()));
        _items.push_back (item_);
    }